

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Output.c
# Opt level: O0

WJTL_STATUS VerifyOutputSigned(int64_t Number,char *StringMatch)

{
  JL_STATUS JVar1;
  int iVar2;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  char *pcStack_30;
  _Bool _result;
  char *jsonString;
  JlDataObject *numberObject;
  char *pcStack_18;
  WJTL_STATUS TestReturn;
  char *StringMatch_local;
  int64_t Number_local;
  
  numberObject._4_4_ = WJTL_STATUS_SUCCESS;
  jsonString = (char *)0x0;
  pcStack_30 = (char *)0x0;
  pcStack_18 = StringMatch;
  StringMatch_local = (char *)Number;
  JVar1 = JlCreateObject(JL_DATA_TYPE_NUMBER,(JlDataObject **)&jsonString);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlCreateObject( JL_DATA_TYPE_NUMBER, &numberObject ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"VerifyOutputSigned",0x40);
  if (JVar1 != JL_STATUS_SUCCESS) {
    numberObject._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlSetObjectNumberS64((JlDataObject *)jsonString,(int64_t)StringMatch_local);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlSetObjectNumberS64( numberObject, Number ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"VerifyOutputSigned",0x41);
  if (JVar1 != JL_STATUS_SUCCESS) {
    numberObject._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlOutputJson((JlDataObject *)jsonString,false,&stack0xffffffffffffffd0);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlOutputJson( numberObject, 0, &jsonString ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"VerifyOutputSigned",0x42);
  if (JVar1 != JL_STATUS_SUCCESS) {
    numberObject._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar2 = strcmp(pcStack_30,pcStack_18);
  WjTestLib_Assert(iVar2 == 0,"strcmp( jsonString, StringMatch ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"VerifyOutputSigned",0x43);
  if (iVar2 != 0) {
    numberObject._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar1 = JlFreeObjectTree((JlDataObject **)&jsonString);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlFreeObjectTree( &numberObject ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"VerifyOutputSigned",0x44);
  if (JVar1 != JL_STATUS_SUCCESS) {
    numberObject._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Free(pcStack_30);
  return numberObject._4_4_;
}

Assistant:

static
WJTL_STATUS
    VerifyOutputSigned
    (
        int64_t     Number,
        char const* StringMatch
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    JlDataObject* numberObject = NULL;
    char* jsonString = NULL;

    JL_ASSERT_SUCCESS( JlCreateObject( JL_DATA_TYPE_NUMBER, &numberObject ) );
    JL_ASSERT_SUCCESS( JlSetObjectNumberS64( numberObject, Number ) );
    JL_ASSERT_SUCCESS( JlOutputJson( numberObject, false, &jsonString ) );
    JL_ASSERT( strcmp( jsonString, StringMatch ) == 0 );
    JL_ASSERT_SUCCESS( JlFreeObjectTree( &numberObject ) );
    JlFree( jsonString );
    jsonString = NULL;

    return TestReturn;
}